

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_edit_dialogues.hpp
# Opt level: O0

void __thiscall PatchEditDialogues::alter_rom(PatchEditDialogues *this,ROM *rom)

{
  ROM *pRVar1;
  Code *pCVar2;
  Code local_268;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  Code local_1c8;
  Code local_148;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  Code local_98;
  ROM *local_18;
  ROM *rom_local;
  PatchEditDialogues *this_local;
  
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._labels._M_t._M_impl._0_8_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._pending_branches._M_t._M_impl._0_8_ = 0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_18 = rom;
  rom_local = (ROM *)this;
  md::Code::Code(&local_98);
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_b8);
  pCVar2 = md::Code::trap(&local_98,'\x01',&local_b8);
  md::ROM::set_code(rom,0x2617a,pCVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_b8);
  md::Code::~Code(&local_98);
  md::ROM::set_word(local_18,0x2617c,0x19a5);
  pRVar1 = local_18;
  local_148._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_148._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_148._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_148._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_148._labels._M_t._M_impl._0_8_ = 0;
  local_148._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_148._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_148._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_148._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_148._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148._pending_branches._M_t._M_impl._0_8_ = 0;
  local_148._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_148._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_148);
  pCVar2 = md::Code::rts(&local_148);
  md::ROM::set_code(pRVar1,0x2617e,pCVar2);
  md::Code::~Code(&local_148);
  md::ROM::mark_empty_chunk(local_18,0x26180,0x261a8);
  md::ROM::set_word(local_18,0x27b20,0x8177);
  md::ROM::set_word(local_18,0x27b22,0xe178);
  pRVar1 = local_18;
  local_1c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_1c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c8._labels._M_t._M_impl._0_8_ = 0;
  local_1c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_1c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_1c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_1c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_1c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_1c8);
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1e8);
  pCVar2 = md::Code::trap(&local_1c8,'\x01',&local_1e8);
  md::ROM::set_code(pRVar1,0x2711e,pCVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1e8);
  md::Code::~Code(&local_1c8);
  md::ROM::set_word(local_18,0x27120,0x1153);
  pRVar1 = local_18;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_268._labels._M_t._M_impl._0_8_ = 0;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_268._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_268._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268._pending_branches._M_t._M_impl._0_8_ = 0;
  local_268._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_268._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  md::Code::Code(&local_268);
  pCVar2 = md::Code::rts(&local_268);
  md::ROM::set_code(pRVar1,0x27122,pCVar2);
  md::Code::~Code(&local_268);
  md::ROM::set_byte(local_18,0x28274,0x84);
  md::ROM::set_byte(local_18,0x28276,0xe4);
  return;
}

Assistant:

void alter_rom(md::ROM& rom) override
    {
        // --- Prospero dialogue ---
        // Change a big story-dependant dialogue branch into one dialogue
        rom.set_code(0x2617A, md::Code().trap(1));
        rom.set_word(0x2617C, 0x19A5);
        rom.set_code(0x2617E, md::Code().rts());
        rom.mark_empty_chunk(0x26180, 0x261A8);

        // Change the unique dialogue script
        rom.set_word(0x27B20, 0x8177); // Message 0x1C4
        rom.set_word(0x27B22, 0xE178); // Message 0x1C5

        // --- Destel boatmaker dialogue ---
        // Change the story-dependant dialogue branch into one dialogue
        rom.set_code(0x2711E, md::Code().trap(1));
        rom.set_word(0x27120, 0x1153);
        rom.set_code(0x27122, md::Code().rts());

        // Change which text line ends the dialogue
        rom.set_byte(0x28274, 0x84);
        rom.set_byte(0x28276, 0xE4);
    }